

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

_binbuf * text_client_getbuf(t_text_client *x)

{
  t_gstub *ptVar1;
  _scalar *p_Var2;
  int iVar3;
  t_pd *pp_Var4;
  t_template *x_00;
  char *pcVar5;
  char *fmt;
  long lVar6;
  int type;
  int onset;
  t_symbol *arraytype;
  int local_28;
  int local_24;
  t_symbol *local_20;
  
  if (x->tc_sym == (t_symbol *)0x0) {
    if (x->tc_struct == (t_symbol *)0x0) {
      return (_binbuf *)0x0;
    }
    x_00 = template_findbyname(x->tc_struct);
    if (x_00 == (t_template *)0x0) {
      pcVar5 = x->tc_struct->s_name;
      fmt = "text: couldn\'t find struct %s";
    }
    else {
      ptVar1 = (x->tc_gp).gp_stub;
      iVar3 = gpointer_check(&x->tc_gp,0);
      if (iVar3 == 0) {
        pd_error(x,"text: stale or empty pointer");
        return (_binbuf *)0x0;
      }
      lVar6 = 0x18;
      if (ptVar1->gs_which == 2) {
        lVar6 = 0;
      }
      p_Var2 = (x->tc_gp).gp_un.gp_scalar;
      iVar3 = template_find_field(x_00,x->tc_field,&local_24,&local_28,&local_20);
      if (iVar3 == 0) {
        pcVar5 = x->tc_field->s_name;
        fmt = "text: no field named %s";
      }
      else {
        if (local_28 == 2) {
          return *(_binbuf **)((long)p_Var2->sc_vec + local_24 + lVar6 + -0x18);
        }
        pcVar5 = x->tc_field->s_name;
        fmt = "text: field %s not of type text";
      }
    }
  }
  else {
    pp_Var4 = pd_findbyclass(x->tc_sym,text_define_class);
    if (pp_Var4 != (t_pd *)0x0) {
      return (_binbuf *)pp_Var4[6];
    }
    pcVar5 = x->tc_sym->s_name;
    fmt = "text: couldn\'t find text buffer \'%s\'";
  }
  pd_error(x,fmt,pcVar5);
  return (_binbuf *)0x0;
}

Assistant:

static t_binbuf *text_client_getbuf(t_text_client *x)
{
    if (x->tc_sym)       /* named text object */
    {
        t_textbuf *y = (t_textbuf *)pd_findbyclass(x->tc_sym,
            text_define_class);
        if (y)
            return (y->b_binbuf);
        else
        {
            pd_error(x, "text: couldn't find text buffer '%s'",
                x->tc_sym->s_name);
            return (0);
        }
    }
    else if (x->tc_struct)   /* by pointer */
    {
        t_template *template = template_findbyname(x->tc_struct);
        t_gstub *gs = x->tc_gp.gp_stub;
        t_word *vec;
        int onset, type;
        t_symbol *arraytype;
        if (!template)
        {
            pd_error(x, "text: couldn't find struct %s", x->tc_struct->s_name);
            return (0);
        }
        if (!gpointer_check(&x->tc_gp, 0))
        {
            pd_error(x, "text: stale or empty pointer");
            return (0);
        }
        if (gs->gs_which == GP_ARRAY)
            vec = x->tc_gp.gp_un.gp_w;
        else vec = x->tc_gp.gp_un.gp_scalar->sc_vec;

        if (!template_find_field(template,
            x->tc_field, &onset, &type, &arraytype))
        {
            pd_error(x, "text: no field named %s", x->tc_field->s_name);
            return (0);
        }
        if (type != DT_TEXT)
        {
            pd_error(x, "text: field %s not of type text", x->tc_field->s_name);
            return (0);
        }
        return (*(t_binbuf **)(((char *)vec) + onset));
    }
    else return (0);    /* shouldn't happen */
}